

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O0

void ptls_ffx_one_pass(ptls_cipher_context_t *enc_ctx,uint8_t *source,size_t source_size,
                      uint8_t *target,size_t target_size,uint8_t mask_last_byte,uint8_t *confusion,
                      uint8_t *iv,uint8_t *tweaks,uint8_t round,uint8_t nb_rounds)

{
  ulong local_48;
  size_t j;
  size_t i;
  uint8_t mask_last_byte_local;
  size_t target_size_local;
  uint8_t *target_local;
  size_t source_size_local;
  uint8_t *source_local;
  ptls_cipher_context_t *enc_ctx_local;
  
  *(undefined8 *)iv = *(undefined8 *)tweaks;
  *(undefined8 *)(iv + 8) = *(undefined8 *)(tweaks + 8);
  iv[(int)(round & 0xf)] = iv[(int)(round & 0xf)] ^ nb_rounds;
  for (j = 0; j < source_size; j = j + 1) {
    iv[j] = iv[j] ^ source[j];
  }
  ptls_cipher_init(enc_ctx,iv);
  ptls_cipher_encrypt(enc_ctx,confusion,"",0x10);
  for (local_48 = 0; local_48 < target_size - 1; local_48 = local_48 + 1) {
    target[local_48] = target[local_48] ^ confusion[local_48];
  }
  target[target_size - 1] = target[target_size - 1] ^ confusion[target_size - 1] & mask_last_byte;
  return;
}

Assistant:

static void ptls_ffx_one_pass(ptls_cipher_context_t *enc_ctx, uint8_t *source, size_t source_size, uint8_t *target,
                              size_t target_size, uint8_t mask_last_byte, uint8_t *confusion, uint8_t *iv, uint8_t *tweaks,
                              uint8_t round, uint8_t nb_rounds)
{
    static const uint8_t zeros[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};

    memcpy(iv, tweaks, 16);
    iv[round & 15] ^= nb_rounds;
    for (size_t i = 0; i < source_size; i++) {
        iv[i] ^= source[i];
    }
    ptls_cipher_init(enc_ctx, iv);
    ptls_cipher_encrypt(enc_ctx, confusion, zeros, 16);
    for (size_t j = 0; j < target_size - 1; j++) {
        target[j] ^= confusion[j];
    }
    target[target_size - 1] ^= (confusion[target_size - 1] & mask_last_byte);
}